

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O0

_Bool cfg_loads(char *json,size_t len,config_item *items)

{
  json_value *value_00;
  json_value *value;
  json_settings settings;
  _Bool rc;
  config_item *items_local;
  size_t len_local;
  char *json_local;
  
  settings.value_extra._7_1_ = 0;
  memset(&value,0,0x30);
  settings.max_memory._0_4_ = 1;
  value_00 = json_parse_ex((json_settings *)&value,json,len,(char *)0x0);
  if (items == (config_item *)0x0) {
    json_local._7_1_ = true;
  }
  else if (value_00 == (json_value *)0x0) {
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c",0x2c,
               "cfg_loads",0,3,"Failed to parse JSON content!");
    json_local._7_1_ = false;
  }
  else {
    settings.value_extra._7_1_ = value_00->type == json_object;
    if ((bool)settings.value_extra._7_1_) {
      settings.value_extra._7_1_ = cfg_parse_simple_object(value_00,items);
    }
    else {
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c",0x34,
                 "cfg_loads",0,3,"Only Object is accepted as JSON config root!");
    }
    json_value_free(value_00);
    json_local._7_1_ = (_Bool)(settings.value_extra._7_1_ & 1);
  }
  return json_local._7_1_;
}

Assistant:

bool cfg_loads(const char * json, size_t len, config_item *items)
{
    bool rc = false;
    json_settings settings = { 0 };
    settings.settings = json_enable_comments;
    json_value* value = json_parse_ex(&settings, json, len, 0);
    
    if (items == NULL)
        // No config item to be processed
        return true;

    if (value == NULL)
    {
        log_error(LOG_ERR, "Failed to parse JSON content!");
        return false;
    }
    // I want root is object only
    rc = value->type == json_object;
    if (rc)
        rc = cfg_parse_simple_object(value, items);
    else
        log_error(LOG_ERR, "Only Object is accepted as JSON config root!");
    json_value_free(value);
    return rc;
}